

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttributeTranslator.cpp
# Opt level: O0

void __thiscall
arangodb::velocypack::AttributeTranslator::add
          (AttributeTranslator *this,string_view key,uint64_t id)

{
  bool bVar1;
  pointer this_00;
  Builder *in_RDI;
  Value *in_stack_ffffffffffffff88;
  Builder *in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  string_view in_stack_ffffffffffffffa8;
  
  bVar1 = std::operator==((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
                           *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (bVar1) {
    std::make_unique<arangodb::velocypack::Builder>();
    std::
    unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>::
    operator=((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
               *)in_stack_ffffffffffffff90,
              (unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
               *)in_stack_ffffffffffffff88);
    std::
    unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>::
    ~unique_ptr((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
                 *)in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff98 =
         std::
         unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
         ::operator->((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
                       *)0x10cfce);
    Value::Value((Value *)in_RDI,(ValueType)((ulong)in_stack_ffffffffffffff98 >> 0x38),
                 SUB81((ulong)in_stack_ffffffffffffff98 >> 0x30,0));
    Builder::add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  this_00 = std::
            unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
            ::operator->((unique_ptr<arangodb::velocypack::Builder,_std::default_delete<arangodb::velocypack::Builder>_>
                          *)0x10cffd);
  Value::Value((Value *)this_00,(uint64_t)in_stack_ffffffffffffff88,None);
  Builder::add(in_RDI,in_stack_ffffffffffffffa8,(Value *)in_stack_ffffffffffffff98);
  (in_RDI->_stack).
  super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&((in_RDI->_stack).
                         super__Vector_base<arangodb::velocypack::Builder::CompoundInfo,_arangodb::velocypack::short_alloc<arangodb::velocypack::Builder::CompoundInfo,_64UL,_8UL>_>
                         ._M_impl.super__Vector_impl_data._M_start)->startPos + 1);
  return;
}

Assistant:

void AttributeTranslator::add(std::string_view key, uint64_t id) {
  if (_builder == nullptr) {
    _builder = std::make_unique<Builder>();
    _builder->add(Value(ValueType::Object));
  }

  _builder->add(key, Value(id));
  _count++;
}